

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdafx.cpp
# Opt level: O2

char * NULLC::defaultFileLoad(char *name,uint *size)

{
  uint __line;
  FILE *__stream;
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  
  if (name == (char *)0x0) {
    pcVar2 = "name";
    __line = 0x36;
  }
  else {
    if (size != (uint *)0x0) {
      __stream = fopen(name,"rb");
      if (__stream == (FILE *)0x0) {
        *size = 0;
      }
      else {
        fseek(__stream,0,2);
        lVar1 = ftell(__stream);
        *size = (uint)lVar1;
        fseek(__stream,0,0);
        pcVar2 = (char *)(*(code *)alloc)(*size + 1);
        sVar3 = fread(pcVar2,1,(ulong)*size,__stream);
        if (*size == (uint)sVar3) {
          pcVar2[sVar3 & 0xffffffff] = '\0';
          fclose(__stream);
          return pcVar2;
        }
        (*(code *)dealloc)(pcVar2);
        *size = 0;
        fclose(__stream);
      }
      return (char *)0x0;
    }
    pcVar2 = "size";
    __line = 0x37;
  }
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/stdafx.cpp"
                ,__line,"const char *NULLC::defaultFileLoad(const char *, unsigned int *)");
}

Assistant:

const char* NULLC::defaultFileLoad(const char* name, unsigned* size)
{
	assert(name);
	assert(size);

	FILE *file = fopen(name, "rb");
	if(file)
	{
		fseek(file, 0, SEEK_END);
		*size = ftell(file);
		fseek(file, 0, SEEK_SET);
		char *fileContent = (char*)NULLC::alloc(*size + 1);
		unsigned read = (unsigned)fread(fileContent, 1, *size, file);

		if(read != *size)
		{
			NULLC::dealloc(fileContent);
			*size = 0;

			fclose(file);
			return NULL;
		}

		fileContent[*size] = 0;
		fclose(file);
		return fileContent;
	}
	*size = 0;
	return NULL;
}